

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::execute_simple_append_interactive
               (string *first_geo,string *second_geo,string *output_geo,string *char_len)

{
  pointer pcVar1;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar1 = (first_geo->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + first_geo->_M_string_length);
  pcVar1 = (second_geo->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + second_geo->_M_string_length);
  pcVar1 = (output_geo->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar1,pcVar1 + output_geo->_M_string_length);
  pcVar1 = (char_len->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + char_len->_M_string_length);
  simple_append(&local_48,&local_68,&local_88,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void UI::execute_simple_append_interactive( std::string first_geo,
                                            std::string second_geo,
                                            std::string output_geo,
                                            std::string char_len)
{
    simple_append(first_geo, second_geo, output_geo, char_len);
}